

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tria_o2.cc
# Opt level: O3

unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> __thiscall
lf::geometry::TriaO2::SubGeometry(TriaO2 *this,dim_t codim,dim_t i)

{
  PointerType pdVar1;
  PointerType pdVar2;
  double dVar3;
  uint uVar4;
  TriaO2 *this_00;
  CommaInitializer<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *pCVar5;
  DenseStorage<double,__1,__1,_3,_0> *other;
  SegmentO2 *this_01;
  _func_int **pp_Var6;
  runtime_error *this_02;
  uint in_ECX;
  ulong i_00;
  _func_int *p_Var7;
  undefined4 in_register_00000034;
  long *plVar8;
  long lVar9;
  Matrix<double,__1,_6,_0,__1,_6> *xpr;
  stringstream ss;
  undefined1 local_258 [32];
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [2];
  undefined1 local_200 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0 [2];
  PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> local_1c8;
  DenseStorage<double,__1,__1,_3,_0> local_1b8;
  undefined1 local_1a8 [392];
  
  plVar8 = (long *)CONCAT44(in_register_00000034,codim);
  if (i == 2) {
    if (5 < in_ECX) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a8 + 0x10),"i is out of bounds",0x12);
      pdVar1 = (PointerType)(local_238 + 0x10);
      local_238._0_8_ = pdVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"0 <= i && i <= 5","");
      pdVar2 = (PointerType)(local_200 + 0x10);
      local_200._0_8_ = pdVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed((string *)local_238,(string *)local_200,0xa4,(string *)local_258);
      if ((Matrix<double,__1,_3,_0,__1,_3> *)local_258._0_8_ !=
          (Matrix<double,__1,_3,_0,__1,_3> *)(local_258 + 0x10)) {
        operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
      }
      if ((PointerType)local_200._0_8_ != pdVar2) {
        operator_delete((void *)local_200._0_8_,local_1f0[0]._M_allocated_capacity + 1);
      }
      if ((PointerType)local_238._0_8_ != pdVar1) {
        operator_delete((void *)local_238._0_8_,local_228[0]._M_allocated_capacity + 1);
      }
      local_238._0_8_ = pdVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"false","");
      local_200._0_8_ = pdVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
                 ,"");
      local_258._0_8_ = (Matrix<double,__1,_3,_0,__1,_3> *)(local_258 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"");
      base::AssertionFailed((string *)local_238,(string *)local_200,0xa4,(string *)local_258);
      goto LAB_002f0ecb;
    }
    Eigen::Block<const_Eigen::Matrix<double,_-1,_6,_0,_-1,_6>,_-1,_1,_true>::Block
              ((Block<const_Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true> *)local_1a8,
               (Matrix<double,__1,_6,_0,__1,_6> *)(plVar8 + 1),(ulong)in_ECX);
    pp_Var6 = (_func_int **)operator_new(0x18);
    local_238._0_8_ = (PointerType)0x0;
    local_238._8_8_ = (_func_int *)0x0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_238,local_1a8._8_8_
               ,1);
    Eigen::internal::
    resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,6,0,_1,6>const,_1,1,true>,double,double>
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_238,
               (Block<const_Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true> *)local_1a8,
               (assign_op<double,_double> *)local_200);
    p_Var7 = (_func_int *)(local_238._8_8_ - ((long)local_238._8_8_ >> 0x3f) & 0xfffffffffffffffe);
    if (1 < (long)local_238._8_8_) {
      lVar9 = 0;
      do {
        dVar3 = ((double *)(local_1a8._0_8_ + lVar9 * 8))[1];
        *(double *)(local_238._0_8_ + lVar9 * 8) = *(double *)(local_1a8._0_8_ + lVar9 * 8);
        ((double *)(local_238._0_8_ + lVar9 * 8))[1] = dVar3;
        lVar9 = lVar9 + 2;
      } while (lVar9 < (long)p_Var7);
    }
    if ((long)p_Var7 < (long)local_238._8_8_) {
      do {
        *(double *)(local_238._0_8_ + (long)p_Var7 * 8) = *(double *)(local_1a8._0_8_ + p_Var7 * 8);
        p_Var7 = p_Var7 + 1;
      } while ((_func_int *)local_238._8_8_ != p_Var7);
    }
    *pp_Var6 = (_func_int *)&PTR_DimLocal_003e8990;
    pp_Var6[1] = (_func_int *)local_238._0_8_;
    pp_Var6[2] = (_func_int *)local_238._8_8_;
    (this->super_Geometry)._vptr_Geometry = pp_Var6;
  }
  else if (i == 1) {
    if (2 < in_ECX) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a8 + 0x10),"i is out of bounds",0x12);
      pdVar1 = (PointerType)(local_238 + 0x10);
      local_238._0_8_ = pdVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"0 <= i && i <= 2","");
      pdVar2 = (PointerType)(local_200 + 0x10);
      local_200._0_8_ = pdVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed((string *)local_238,(string *)local_200,0x9c,(string *)local_258);
      if ((Matrix<double,__1,_3,_0,__1,_3> *)local_258._0_8_ !=
          (Matrix<double,__1,_3,_0,__1,_3> *)(local_258 + 0x10)) {
        operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
      }
      if ((PointerType)local_200._0_8_ != pdVar2) {
        operator_delete((void *)local_200._0_8_,local_1f0[0]._M_allocated_capacity + 1);
      }
      if ((PointerType)local_238._0_8_ != pdVar1) {
        operator_delete((void *)local_238._0_8_,local_228[0]._M_allocated_capacity + 1);
      }
      local_238._0_8_ = pdVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"false","");
      local_200._0_8_ = pdVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
                 ,"");
      local_258._0_8_ = (Matrix<double,__1,_3,_0,__1,_3> *)(local_258 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"");
      base::AssertionFailed((string *)local_238,(string *)local_200,0x9c,(string *)local_258);
      goto LAB_002f0ecb;
    }
    uVar4 = (**(code **)(*plVar8 + 8))(plVar8);
    local_1c8.m_storage.m_data = (double *)0x0;
    local_1c8.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::resize
              (&local_1c8,(ulong)uVar4,3);
    xpr = (Matrix<double,__1,_6,_0,__1,_6> *)(plVar8 + 1);
    Eigen::Block<const_Eigen::Matrix<double,_-1,_6,_0,_-1,_6>,_-1,_1,_true>::Block
              ((Block<const_Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true> *)local_1a8,xpr,
               (ulong)in_ECX);
    Eigen::CommaInitializer<Eigen::Matrix<double,-1,3,0,-1,3>>::
    CommaInitializer<Eigen::Block<Eigen::Matrix<double,_1,6,0,_1,6>const,_1,1,true>>
              ((CommaInitializer<Eigen::Matrix<double,_1,3,0,_1,3>> *)local_258,
               (Matrix<double,__1,_3,_0,__1,_3> *)&local_1c8,
               (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true>_>
                *)local_1a8);
    i_00 = 0;
    if (in_ECX != 2) {
      i_00 = (ulong)(in_ECX + 1);
    }
    Eigen::Block<const_Eigen::Matrix<double,_-1,_6,_0,_-1,_6>,_-1,_1,_true>::Block
              ((Block<const_Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true> *)local_238,xpr,
               i_00);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,3,0,-1,3>>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,_1,3,0,_1,3>> *)local_258,
                        (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true>_>
                         *)local_238);
    Eigen::Block<const_Eigen::Matrix<double,_-1,_6,_0,_-1,_6>,_-1,_1,_true>::Block
              ((Block<const_Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true> *)local_200,xpr,
               (ulong)(in_ECX + 3));
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,3,0,-1,3>>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,_1,3,0,_1,3>> *)pCVar5,
                        (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true>_>
                         *)local_200);
    other = (DenseStorage<double,__1,__1,_3,_0> *)
            Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::finished(pCVar5);
    this_01 = (SegmentO2 *)operator_new(0x60);
    Eigen::DenseStorage<double,_-1,_-1,_3,_0>::DenseStorage(&local_1b8,other);
    SegmentO2::SegmentO2(this_01,(Matrix<double,__1,_3,_0,__1,_3> *)&local_1b8);
    free(local_1b8.m_data);
    (this->super_Geometry)._vptr_Geometry = (_func_int **)this_01;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)local_258);
    free(local_1c8.m_storage.m_data);
  }
  else {
    if (i != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a8 + 0x10),"codim is out of bounds",0x16);
      local_238._0_8_ = local_238 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"false","");
      local_200._0_8_ = local_200 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed((string *)local_238,(string *)local_200,0xa8,(string *)local_258);
      if ((Matrix<double,__1,_3,_0,__1,_3> *)local_258._0_8_ !=
          (Matrix<double,__1,_3,_0,__1,_3> *)(local_258 + 0x10)) {
        operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
      }
      if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
        operator_delete((void *)local_200._0_8_,local_1f0[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
        operator_delete((void *)local_238._0_8_,local_228[0]._M_allocated_capacity + 1);
      }
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,"this code should not be reached");
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (in_ECX != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a8 + 0x10),"i is out of bounds",0x12);
      pdVar1 = (PointerType)(local_238 + 0x10);
      local_238._0_8_ = pdVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"i == 0","");
      pdVar2 = (PointerType)(local_200 + 0x10);
      local_200._0_8_ = pdVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed((string *)local_238,(string *)local_200,0x98,(string *)local_258);
      if ((Matrix<double,__1,_3,_0,__1,_3> *)local_258._0_8_ !=
          (Matrix<double,__1,_3,_0,__1,_3> *)(local_258 + 0x10)) {
        operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
      }
      if ((PointerType)local_200._0_8_ != pdVar2) {
        operator_delete((void *)local_200._0_8_,local_1f0[0]._M_allocated_capacity + 1);
      }
      if ((PointerType)local_238._0_8_ != pdVar1) {
        operator_delete((void *)local_238._0_8_,local_228[0]._M_allocated_capacity + 1);
      }
      local_238._0_8_ = pdVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"false","");
      local_200._0_8_ = pdVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
                 ,"");
      local_258._0_8_ = (Matrix<double,__1,_3,_0,__1,_3> *)(local_258 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"");
      base::AssertionFailed((string *)local_238,(string *)local_200,0x98,(string *)local_258);
LAB_002f0ecb:
      std::__cxx11::string::~string((string *)local_258);
      std::__cxx11::string::~string((string *)local_200);
      std::__cxx11::string::~string((string *)local_238);
      abort();
    }
    this_00 = (TriaO2 *)operator_new(0x68);
    Eigen::DenseStorage<double,_-1,_-1,_6,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_6,_0> *)local_1a8,
               (DenseStorage<double,__1,__1,_6,_0> *)(plVar8 + 1));
    TriaO2(this_00,(Matrix<double,__1,_6,_0,__1,_6> *)local_1a8);
    free((void *)local_1a8._0_8_);
    (this->super_Geometry)._vptr_Geometry = (_func_int **)this_00;
  }
  return (__uniq_ptr_data<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>,_true,_true>
          )(__uniq_ptr_data<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Geometry> TriaO2::SubGeometry(dim_t codim, dim_t i) const {
  switch (codim) {
    case 0: {
      LF_ASSERT_MSG(i == 0, "i is out of bounds");
      return std::make_unique<TriaO2>(coords_);
    }
    case 1: {
      LF_ASSERT_MSG(0 <= i && i <= 2, "i is out of bounds");
      return std::make_unique<SegmentO2>(
          (Eigen::Matrix<double, Eigen::Dynamic, 3>(DimGlobal(), 3)
               << coords_.col(i),
           coords_.col((i + 1) % 3), coords_.col(i + 3))
              .finished());
    }
    case 2: {
      LF_ASSERT_MSG(0 <= i && i <= 5, "i is out of bounds");
      return std::make_unique<Point>(coords_.col(i));
    }
    default: {
      LF_VERIFY_MSG(false, "codim is out of bounds")
    }
  }
}